

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O0

void set_reference_points
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
               bool with_distances,double *numeric_data,int *categ_data,bool is_col_major,
               size_t ld_numeric,size_t ld_categ,double *Xc,size_t *Xc_ind,size_t *Xc_indptr,
               double *Xr,size_t *Xr_ind,size_t *Xr_indptr,size_t nrows,int nthreads)

{
  undefined8 unaff_RBX;
  ExtIsoForest *unaff_RBP;
  int *unaff_R12;
  double *unaff_R13;
  undefined8 unaff_R14;
  TreesIndexer *unaff_R15;
  IsoForest *unaff_retaddr;
  size_t in_stack_00000048;
  size_t in_stack_00000050;
  undefined4 in_stack_00000058;
  undefined4 in_stack_0000005c;
  unsigned_long *in_stack_00000060;
  unsigned_long *in_stack_00000068;
  undefined7 in_stack_00000070;
  undefined7 in_stack_00000088;
  
  set_reference_points<double,unsigned_long>
            (unaff_retaddr,unaff_RBP,unaff_R15,SUB81((ulong)unaff_R14 >> 0x38,0),unaff_R13,unaff_R12
             ,SUB81((ulong)unaff_RBX >> 0x38,0),in_stack_00000048,in_stack_00000050,
             (double *)CONCAT44(in_stack_0000005c,in_stack_00000058),in_stack_00000060,
             in_stack_00000068,(double *)CONCAT17(is_col_major,in_stack_00000070),
             (unsigned_long *)categ_data,(unsigned_long *)numeric_data,
             CONCAT17(with_distances,in_stack_00000088),(int)indexer);
  return;
}

Assistant:

ISOTREE_EXPORTED void set_reference_points(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext, TreesIndexer *indexer,
                          const bool with_distances,
                          real_t *numeric_data, int *categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *Xc, sparse_ix *Xc_ind, sparse_ix *Xc_indptr,
                          real_t *Xr, sparse_ix *Xr_ind, sparse_ix *Xr_indptr,
                          size_t nrows, int nthreads)
{
    set_reference_points<real_t, sparse_ix>
                        (model_outputs, model_outputs_ext, indexer,
                         with_distances,
                         numeric_data, categ_data,
                         is_col_major, ld_numeric, ld_categ,
                         Xc, Xc_ind, Xc_indptr,
                         Xr, Xr_ind, Xr_indptr,
                         nrows, nthreads);
}